

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TagAlias::TagAlias(TagAlias *this,string *_tag,SourceLineInfo *_lineInfo)

{
  SourceLineInfo *in_RDX;
  string *in_RSI;
  SourceLineInfo *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,in_RSI);
  SourceLineInfo::SourceLineInfo(in_RDX,in_RDI);
  return;
}

Assistant:

TagAlias( std::string _tag, SourceLineInfo _lineInfo ) : tag( _tag ), lineInfo( _lineInfo ) {}